

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O3

void update_loff(hts_idx_t *idx,int i,int free_lidx)

{
  khint_t kVar1;
  bidx_t *pbVar2;
  uint64_t *puVar3;
  khint32_t *pkVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  uint64_t uVar8;
  lidx_t *plVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  char cVar14;
  int iVar16;
  char cVar15;
  
  pbVar2 = idx->bidx[i];
  plVar9 = idx->lidx + i;
  if (pbVar2 == (bidx_t *)0x0) {
    uVar11 = plVar9->n;
    uVar7 = 1;
  }
  else {
    kVar1 = pbVar2->n_buckets;
    if (kVar1 == 0) {
      uVar11 = 0;
LAB_0010d363:
      if (uVar11 == kVar1) {
        uVar8 = 0;
      }
      else {
        uVar8 = (pbVar2->vals[uVar11].list)->u;
      }
    }
    else {
      uVar12 = idx->n_bins + 1;
      uVar10 = kVar1 - 1 & uVar12;
      iVar16 = 1;
      uVar8 = 0;
      uVar11 = uVar10;
      do {
        bVar5 = (char)uVar11 * '\x02' & 0x1e;
        uVar13 = pbVar2->flags[uVar11 >> 4] >> bVar5;
        if (((uVar13 & 2) != 0) || (((uVar13 & 1) == 0 && (pbVar2->keys[uVar11] == uVar12)))) {
          if ((pbVar2->flags[uVar11 >> 4] >> bVar5 & 3) != 0) {
            uVar11 = kVar1;
          }
          goto LAB_0010d363;
        }
        uVar11 = uVar11 + iVar16 & kVar1 - 1;
        iVar16 = iVar16 + 1;
      } while (uVar11 != uVar10);
    }
    uVar11 = plVar9->n;
    if (0 < (int)uVar11) {
      puVar3 = plVar9->offset;
      uVar7 = 0;
      do {
        if (puVar3[uVar7] != 0xffffffffffffffff) goto LAB_0010d3a3;
        puVar3[uVar7] = uVar8;
        uVar7 = uVar7 + 1;
      } while (uVar11 != uVar7);
      goto LAB_0010d3c4;
    }
    uVar7 = 0;
  }
LAB_0010d3a3:
  if ((int)uVar7 < (int)uVar11) {
    puVar3 = plVar9->offset;
    uVar7 = uVar7 & 0xffffffff;
    do {
      if (puVar3[uVar7] == 0xffffffffffffffff) {
        puVar3[uVar7] = puVar3[uVar7 - 1];
      }
      uVar7 = uVar7 + 1;
    } while ((int)uVar7 < (int)uVar11);
  }
LAB_0010d3c4:
  if (pbVar2 != (bidx_t *)0x0) {
    uVar10 = pbVar2->n_buckets;
    if ((ulong)uVar10 != 0) {
      pkVar4 = pbVar2->flags;
      uVar7 = 0;
      do {
        if ((pkVar4[uVar7 >> 4 & 0xfffffff] >> ((char)uVar7 * '\x02' & 0x1fU) & 3) == 0) {
          uVar12 = pbVar2->keys[uVar7];
          if (uVar12 < (uint)idx->n_bins) {
            cVar15 = '\0';
            cVar14 = '\0';
            uVar13 = uVar12;
            if (uVar12 != 0) {
              do {
                cVar14 = cVar15 + '\x01';
                uVar6 = uVar13 - 1;
                uVar13 = (int)uVar6 >> 3;
                cVar15 = cVar14;
              } while (7 < uVar6);
            }
            iVar16 = uVar12 - (uint)((ulong)(uint)~(-1 << (cVar14 * '\x03' & 0x1fU)) * 0x92492493 >>
                                    0x22) << (((char)idx->n_lvls - cVar14) * '\x03' & 0x1fU);
            if ((int)uVar11 <= iVar16) goto LAB_0010d45d;
            uVar8 = plVar9->offset[iVar16];
          }
          else {
LAB_0010d45d:
            uVar8 = 0;
          }
          pbVar2->vals[uVar7].loff = uVar8;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar10);
    }
    if (free_lidx != 0) {
      free(plVar9->offset);
      plVar9->n = 0;
      plVar9->m = 0;
      plVar9->offset = (uint64_t *)0x0;
    }
  }
  return;
}

Assistant:

static void update_loff(hts_idx_t *idx, int i, int free_lidx)
{
    bidx_t *bidx = idx->bidx[i];
    lidx_t *lidx = &idx->lidx[i];
    khint_t k;
    int l;
    uint64_t offset0 = 0;
    if (bidx) {
        k = kh_get(bin, bidx, META_BIN(idx));
        if (k != kh_end(bidx))
            offset0 = kh_val(bidx, k).list[0].u;
        for (l = 0; l < lidx->n && lidx->offset[l] == (uint64_t)-1; ++l)
            lidx->offset[l] = offset0;
    } else l = 1;
    for (; l < lidx->n; ++l) // fill missing values
        if (lidx->offset[l] == (uint64_t)-1)
            lidx->offset[l] = lidx->offset[l-1];
    if (bidx == 0) return;
    for (k = kh_begin(bidx); k != kh_end(bidx); ++k) // set loff
        if (kh_exist(bidx, k))
        {
            if ( kh_key(bidx, k) < idx->n_bins )
            {
                int bot_bin = hts_bin_bot(kh_key(bidx, k), idx->n_lvls);
                // disable linear index if bot_bin out of bounds
                kh_val(bidx, k).loff = bot_bin < lidx->n ? lidx->offset[bot_bin] : 0;
            }
            else
                kh_val(bidx, k).loff = 0;
        }
    if (free_lidx) {
        free(lidx->offset);
        lidx->m = lidx->n = 0;
        lidx->offset = 0;
    }
}